

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O1

void __thiscall icu_63::ResourceBundle::~ResourceBundle(ResourceBundle *this)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__ResourceBundle_003fbf70;
  if (this->fResource != (UResourceBundle *)0x0) {
    ures_close_63(this->fResource);
  }
  if (this->fLocale != (Locale *)0x0) {
    (*(this->fLocale->super_UObject)._vptr_UObject[1])();
  }
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

ResourceBundle::~ResourceBundle()
{
    if(fResource != 0) {
        ures_close(fResource);
    }
    if(fLocale != NULL) {
      delete(fLocale);
    }
}